

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *column,Index pos,Dimension dim
          )

{
  Index local_54;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  local_50;
  
  local_54 = pos;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::Intrusive_list_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)&local_50,column,dim,*(Column_settings **)(this + 0x1a0));
  std::
  unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>>>
  ::
  try_emplace<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>>>
              *)(this + 0x160),&local_54,&local_50);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
  ::~Intrusive_list_column(&local_50);
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,dim);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}